

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,Int value)

{
  uint uVar1;
  char *pcVar2;
  uint value_00;
  allocator local_41;
  char *local_40;
  char buffer [32];
  
  local_40 = &stack0xffffffffffffffe8;
  uVar1 = (uint)this;
  value_00 = -uVar1;
  if (0 < (int)uVar1) {
    value_00 = uVar1;
  }
  uintToString(value_00,&local_40);
  pcVar2 = local_40;
  if ((int)uVar1 < 0) {
    local_40[-1] = '-';
    pcVar2 = pcVar2 + -1;
  }
  if (buffer <= pcVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_41);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_writer.cpp"
                ,0x49,"std::string Json::valueToString(Int)");
}

Assistant:

std::string valueToString ( Int value )
{
    char buffer[32];
    char* current = buffer + sizeof (buffer);
    bool isNegative = value < 0;

    if ( isNegative )
        value = -value;

    uintToString ( UInt (value), current );

    if ( isNegative )
        *--current = '-';

    assert ( current >= buffer );
    return current;
}